

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_detach(AMQP_VALUE value,DETACH_HANDLE *detach_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  ERROR_HANDLE local_50;
  ERROR_HANDLE error;
  _Bool closed;
  AMQP_VALUE pAStack_40;
  handle handle;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  DETACH_INSTANCE *detach_instance;
  DETACH_HANDLE *ppDStack_18;
  int result;
  DETACH_HANDLE *detach_handle_local;
  AMQP_VALUE value_local;
  
  ppDStack_18 = detach_handle;
  detach_handle_local = (DETACH_HANDLE *)value;
  list_value = (AMQP_VALUE)detach_create_internal();
  *ppDStack_18 = (DETACH_HANDLE)list_value;
  if (*ppDStack_18 == (DETACH_HANDLE)0x0) {
    detach_instance._4_4_ = 0x23f6;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)detach_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      detach_destroy(*ppDStack_18);
      detach_instance._4_4_ = 0x23fe;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if (item_value._4_4_ == 0) {
          detach_instance._4_4_ = 0x2432;
        }
        else {
          pAStack_40 = amqpvalue_get_list_item(pAStack_30,0);
          if (pAStack_40 == (AMQP_VALUE)0x0) {
            detach_destroy(*ppDStack_18);
            detach_instance._4_4_ = 0x2414;
          }
          else {
            AVar2 = amqpvalue_get_type(pAStack_40);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAStack_40);
              detach_destroy(*ppDStack_18);
              detach_instance._4_4_ = 0x241e;
            }
            else {
              iVar1 = amqpvalue_get_uint(pAStack_40,(uint32_t *)((long)&error + 4));
              if (iVar1 == 0) {
                amqpvalue_destroy(pAStack_40);
                if ((1 < item_value._4_4_) &&
                   (pAStack_40 = amqpvalue_get_list_item(pAStack_30,1),
                   pAStack_40 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAStack_40);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar1 = amqpvalue_get_boolean(pAStack_40,(_Bool *)((long)&error + 3)),
                     iVar1 != 0)) {
                    amqpvalue_destroy(pAStack_40);
                    detach_destroy(*ppDStack_18);
                    return 0x244a;
                  }
                  amqpvalue_destroy(pAStack_40);
                }
                if ((2 < item_value._4_4_) &&
                   (pAStack_40 = amqpvalue_get_list_item(pAStack_30,2),
                   pAStack_40 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAStack_40);
                  if (AVar2 != AMQP_TYPE_NULL) {
                    iVar1 = amqpvalue_get_error(pAStack_40,&local_50);
                    if (iVar1 != 0) {
                      amqpvalue_destroy(pAStack_40);
                      detach_destroy(*ppDStack_18);
                      return 0x2467;
                    }
                    error_destroy(local_50);
                  }
                  amqpvalue_destroy(pAStack_40);
                }
                pAVar3 = amqpvalue_clone((AMQP_VALUE)detach_handle_local);
                *(AMQP_VALUE *)list_value = pAVar3;
                detach_instance._4_4_ = 0;
              }
              else {
                amqpvalue_destroy(pAStack_40);
                detach_destroy(*ppDStack_18);
                detach_instance._4_4_ = 0x2428;
              }
            }
          }
        }
      }
      else {
        detach_instance._4_4_ = 0x2405;
      }
    }
  }
  return detach_instance._4_4_;
}

Assistant:

int amqpvalue_get_detach(AMQP_VALUE value, DETACH_HANDLE* detach_handle)
{
    int result;
    DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)detach_create_internal();
    *detach_handle = detach_instance;
    if (*detach_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            detach_destroy(*detach_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* handle */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                detach_destroy(*detach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                detach_destroy(*detach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                handle handle;
                                if (amqpvalue_get_handle(item_value, &handle) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    detach_destroy(*detach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* closed */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool closed;
                                if (amqpvalue_get_boolean(item_value, &closed) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    detach_destroy(*detach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* error */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ERROR_HANDLE error;
                                if (amqpvalue_get_error(item_value, &error) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    detach_destroy(*detach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                                else
                                {
                                    error_destroy(error);
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    detach_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}